

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

void bk_lib::detail::fill<Clasp::OutputTable::PredType>(PredType *first,PredType *last,PredType *x)

{
  int *piVar1;
  uint32 uVar2;
  RefCount *p_2;
  RefCount *p;
  PredType *pPVar3;
  PredType *pPVar4;
  
  pPVar3 = first;
  pPVar4 = first;
  switch((uint)((int)last - (int)first) >> 4 & 7) {
  case 0:
    while (pPVar3 != last) {
      first = pPVar3 + 1;
      piVar1 = (int *)(x->name).ref_;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      (pPVar3->name).ref_ = (RefType)piVar1;
      uVar2 = x->user;
      pPVar3->cond = (Literal)(x->cond).rep_;
      pPVar3->user = uVar2;
switchD_0015d427_caseD_7:
      pPVar4 = first + 1;
      piVar1 = (int *)(x->name).ref_;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      (first->name).ref_ = (RefType)piVar1;
      uVar2 = x->user;
      first->cond = (Literal)(x->cond).rep_;
      first->user = uVar2;
switchD_0015d427_caseD_6:
      first = pPVar4 + 1;
      piVar1 = (int *)(x->name).ref_;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      (pPVar4->name).ref_ = (RefType)piVar1;
      uVar2 = x->user;
      pPVar4->cond = (Literal)(x->cond).rep_;
      pPVar4->user = uVar2;
switchD_0015d427_caseD_5:
      pPVar4 = first + 1;
      piVar1 = (int *)(x->name).ref_;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      (first->name).ref_ = (RefType)piVar1;
      uVar2 = x->user;
      first->cond = (Literal)(x->cond).rep_;
      first->user = uVar2;
switchD_0015d427_caseD_4:
      pPVar3 = pPVar4 + 1;
      piVar1 = (int *)(x->name).ref_;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      (pPVar4->name).ref_ = (RefType)piVar1;
      uVar2 = x->user;
      pPVar4->cond = (Literal)(x->cond).rep_;
      pPVar4->user = uVar2;
switchD_0015d427_caseD_3:
      first = pPVar3 + 1;
      piVar1 = (int *)(x->name).ref_;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      (pPVar3->name).ref_ = (RefType)piVar1;
      uVar2 = x->user;
      pPVar3->cond = (Literal)(x->cond).rep_;
      pPVar3->user = uVar2;
switchD_0015d427_caseD_2:
      pPVar4 = first + 1;
      piVar1 = (int *)(x->name).ref_;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      (first->name).ref_ = (RefType)piVar1;
      uVar2 = x->user;
      first->cond = (Literal)(x->cond).rep_;
      first->user = uVar2;
switchD_0015d427_caseD_1:
      pPVar3 = pPVar4 + 1;
      piVar1 = (int *)(x->name).ref_;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      (pPVar4->name).ref_ = (RefType)piVar1;
      uVar2 = x->user;
      pPVar4->cond = (Literal)(x->cond).rep_;
      pPVar4->user = uVar2;
    }
    break;
  case 1:
    goto switchD_0015d427_caseD_1;
  case 2:
    goto switchD_0015d427_caseD_2;
  case 3:
    goto switchD_0015d427_caseD_3;
  case 4:
    goto switchD_0015d427_caseD_4;
  case 5:
    goto switchD_0015d427_caseD_5;
  case 6:
    goto switchD_0015d427_caseD_6;
  case 7:
    goto switchD_0015d427_caseD_7;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}